

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

bool getIndexed(Image *output,vector<unsigned_char,_std::allocator<unsigned_char>_> *input,Size size
               ,bool isSwitch,int colors)

{
  int iVar1;
  Color *__first;
  pointer pCVar2;
  pointer puVar3;
  int iVar4;
  undefined7 in_register_00000009;
  long lVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  vector<Color,_std::allocator<Color>_> table;
  allocator_type local_4d;
  undefined4 local_4c;
  _Vector_base<Color,_std::allocator<Color>_> local_48;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,isSwitch);
  iVar9 = size.width;
  __first = (Color *)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(colors << 2);
  std::vector<Color,std::allocator<Color>>::vector<Color*,void>
            ((vector<Color,std::allocator<Color>> *)&local_48,__first,(Color *)(&__first->r + lVar5)
             ,&local_4d);
  output->size = size;
  pCVar2 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  uVar8 = (ulong)(size.height * iVar9 + colors * 4);
  for (; lVar5 < (long)uVar8; lVar5 = lVar5 + 1) {
    std::vector<Color,_std::allocator<Color>_>::push_back
              (&output->colorData,
               local_48._M_impl.super__Vector_impl_data._M_start +
               (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5]);
  }
  puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  iVar1 = (output->size).width;
  pCVar2 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  for (uVar7 = uVar8; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    pCVar2[(iVar4 / iVar9) * iVar1 + iVar4 % iVar9].a = puVar3[uVar7];
    iVar4 = iVar4 + 1;
  }
  if ((char)local_4c == '\0') {
    swapBR(output);
    uVar6 = (long)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start;
  }
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_48);
  return uVar6 != uVar8;
}

Assistant:

bool getIndexed(Image &output, const std::vector<uint8_t> &input, Size size, bool isSwitch, int colors) {
	assert(input.size() >= colors * 4 + size.area());
	int imgStart = colors * 4;
	int maskStart = imgStart + size.area();
	std::vector<Color> table((Color *)&input[0], (Color *)&input[imgStart]);

	output.size = size;
	output.colorData.clear();
	for (int i = imgStart; i < maskStart; i++) {
		output.colorData.push_back(table[input[i]]);
	}
	for (int i = maskStart; i < input.size(); i++) {
		int x = (i - maskStart) % size.width;
		int y = (i - maskStart) / size.width;
		output.pixel(x, y).a = input[i];
	}

	if (!isSwitch) { swapBR(output); }
	return maskStart != input.size();
}